

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_1::CullingTest::iterate(CullingTest *this)

{
  undefined8 *puVar1;
  float fVar2;
  undefined4 uVar3;
  GLenum GVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  int iVar8;
  undefined4 extraout_var;
  char *pcVar9;
  size_t sVar10;
  pointer pVVar11;
  pointer pVVar12;
  int iVar13;
  long lVar14;
  float *pfVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  Surface resultImage;
  Random rnd;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_228;
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  local_208;
  CullingTest *local_1e8;
  Surface local_1e0;
  undefined1 local_1c8 [8];
  pointer pSStack_1c0;
  pointer local_1b8;
  float afStack_1b0 [2];
  float local_1a8 [2];
  float afStack_1a0 [2];
  float local_198 [12];
  bool local_168;
  bool local_167;
  bool local_166;
  ios_base local_150 [264];
  RasterizationArguments local_48;
  
  iVar8 = (this->super_BaseRenderingCase).m_renderSize;
  tcu::Surface::Surface(&local_1e0,iVar8,iVar8);
  local_228.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  deRandom_init((deRandom *)local_1c8,0x849ea);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize(&local_228,6);
  if (0 < (int)((ulong)((long)local_228.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_228.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
    lVar17 = 0;
    lVar16 = 0;
    do {
      fVar19 = deRandom_getFloat((deRandom *)local_1c8);
      *(float *)((long)(local_228.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar17) =
           fVar19 * 1.8 + -0.9;
      fVar19 = deRandom_getFloat((deRandom *)local_1c8);
      *(float *)((long)(local_228.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar17 + 4) =
           fVar19 * 1.8 + -0.9;
      *(undefined8 *)
       ((long)(local_228.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->m_data + lVar17 + 8) = 0x3f80000000000000;
      lVar16 = lVar16 + 1;
      lVar17 = lVar17 + 0x10;
    } while (lVar16 < (int)((ulong)((long)local_228.
                                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_228.
                                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4));
  }
  iVar8 = *(int *)&(this->super_BaseRenderingCase).field_0xc4;
  if (iVar8 != 0x408) {
    bVar7 = (iVar8 == 0x404) != (this->m_faceOrder == 0x901);
    GVar4 = this->m_primitive;
    if (GVar4 == 4) {
      if (0 < (int)((ulong)((long)local_228.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_228.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) + -2) {
        iVar8 = 0;
        pVVar11 = local_228.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pVVar12 = local_228.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        do {
          iVar13 = iVar8 + 2;
          auVar25._4_4_ = pVVar11[iVar8].m_data[0];
          auVar25._0_4_ = pVVar11[(long)iVar8 + 1].m_data[0];
          auVar25._8_8_ = 0;
          auVar21._4_4_ = pVVar11[iVar8].m_data[3];
          auVar21._0_4_ = pVVar11[(long)iVar8 + 1].m_data[3];
          auVar21._8_8_ = 0;
          auVar21 = divps(auVar25,auVar21);
          auVar29._4_4_ = pVVar11[iVar8].m_data[1];
          auVar29._0_4_ = pVVar11[iVar13].m_data[1];
          auVar29._8_8_ = 0;
          auVar27._4_4_ = pVVar11[iVar8].m_data[3];
          auVar27._0_4_ = pVVar11[iVar13].m_data[3];
          auVar27._8_8_ = 0;
          auVar27 = divps(auVar29,auVar27);
          if (bVar7 != (auVar27._0_4_ - auVar27._4_4_) * (auVar21._0_4_ - auVar21._4_4_) -
                       (pVVar11[(long)iVar8 + 1].m_data[1] / pVVar11[(long)iVar8 + 1].m_data[3] -
                       auVar27._4_4_) *
                       (pVVar11[iVar13].m_data[0] / pVVar11[iVar13].m_data[3] - auVar21._4_4_) < 0.0
             ) {
            local_198[8] = 0.0;
            local_198[9] = 0.0;
            local_198[10] = 0.0;
            local_198[0xb] = 0.0;
            local_198[4] = 0.0;
            local_198[5] = 0.0;
            local_198[6] = 0.0;
            local_198[7] = 0.0;
            local_198[0] = 0.0;
            local_198[1] = 0.0;
            local_198[2] = 0.0;
            local_198[3] = 0.0;
            local_1c8 = *(undefined1 (*) [8])pVVar11[iVar8].m_data;
            pSStack_1c0 = *(pointer *)(pVVar11[iVar8].m_data + 2);
            local_168 = false;
            local_1b8 = *(pointer *)pVVar11[(long)iVar8 + 1].m_data;
            afStack_1b0 = *(float (*) [2])(pVVar11[(long)iVar8 + 1].m_data + 2);
            local_167 = false;
            local_1a8 = *(float (*) [2])pVVar11[iVar13].m_data;
            afStack_1a0 = *(float (*) [2])(pVVar11[iVar13].m_data + 2);
            local_166 = false;
            std::
            vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            ::push_back(&local_208,(value_type *)local_1c8);
            pVVar11 = local_228.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pVVar12 = local_228.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          iVar8 = iVar8 + 3;
        } while (iVar8 < (int)((ulong)((long)pVVar12 - (long)pVVar11) >> 4) + -2);
      }
    }
    else if (GVar4 == 5) {
      if (0 < (int)((ulong)((long)local_228.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_228.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) + -2) {
        lVar17 = 0x200000000;
        lVar18 = 0;
        lVar16 = 0;
        pVVar11 = local_228.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pVVar12 = local_228.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        local_1e8 = this;
        do {
          lVar14 = lVar17 >> 0x1c;
          fVar19 = *(float *)((long)pVVar11[1].m_data + lVar18 + 0xc);
          uVar3 = *(undefined4 *)((long)pVVar11->m_data + lVar18 + 0xc);
          auVar24._4_4_ = *(undefined4 *)((long)pVVar11->m_data + lVar18);
          auVar24._0_4_ = *(undefined4 *)((long)pVVar11[1].m_data + lVar18);
          auVar24._8_8_ = 0;
          auVar6._4_4_ = uVar3;
          auVar6._0_4_ = fVar19;
          auVar6._8_8_ = 0;
          auVar21 = divps(auVar24,auVar6);
          fVar2 = *(float *)((long)pVVar11->m_data + lVar14 + 0xc);
          auVar28._4_4_ = *(undefined4 *)((long)pVVar11->m_data + lVar18 + 4);
          auVar28._0_4_ = *(undefined4 *)((long)pVVar11->m_data + lVar14 + 4);
          auVar28._8_8_ = 0;
          auVar22._4_4_ = uVar3;
          auVar22._0_4_ = fVar2;
          auVar22._8_8_ = 0;
          auVar27 = divps(auVar28,auVar22);
          if (((uint)lVar16 & 1 ^ (uint)bVar7) !=
              (uint)((auVar27._0_4_ - auVar27._4_4_) * (auVar21._0_4_ - auVar21._4_4_) -
                     (*(float *)((long)pVVar11[1].m_data + lVar18 + 4) / fVar19 - auVar27._4_4_) *
                     (*(float *)((long)pVVar11->m_data + lVar14) / fVar2 - auVar21._4_4_) < 0.0)) {
            puVar1 = (undefined8 *)((long)pVVar11->m_data + lVar18);
            pfVar15 = (float *)((long)pVVar11->m_data + lVar14);
            local_198[8] = 0.0;
            local_198[9] = 0.0;
            local_198[10] = 0.0;
            local_198[0xb] = 0.0;
            local_198[4] = 0.0;
            local_198[5] = 0.0;
            local_198[6] = 0.0;
            local_198[7] = 0.0;
            local_198[0] = 0.0;
            local_198[1] = 0.0;
            local_198[2] = 0.0;
            local_198[3] = 0.0;
            local_1c8 = (undefined1  [8])*puVar1;
            pSStack_1c0 = (pointer)puVar1[1];
            local_168 = false;
            local_1b8 = *(pointer *)((long)pVVar11[1].m_data + lVar18);
            afStack_1b0 = *(float (*) [2])((long)pVVar11[1].m_data + lVar18 + 8);
            local_167 = false;
            local_1a8 = *(float (*) [2])pfVar15;
            afStack_1a0 = *(float (*) [2])(pfVar15 + 2);
            local_166 = false;
            std::
            vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            ::push_back(&local_208,(value_type *)local_1c8);
            pVVar11 = local_228.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pVVar12 = local_228.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            this = local_1e8;
          }
          lVar16 = lVar16 + 1;
          lVar17 = lVar17 + 0x100000000;
          lVar18 = lVar18 + 0x10;
        } while (lVar16 < ((long)pVVar12 - (long)pVVar11) * 0x10000000 + -0x200000000 >> 0x20);
      }
    }
    else if ((GVar4 == 6) &&
            (1 < (int)((ulong)((long)local_228.
                                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_228.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4) + -1)) {
      lVar16 = 1;
      lVar17 = 0x10;
      pVVar11 = local_228.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pVVar12 = local_228.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      do {
        fVar19 = *(float *)((long)pVVar11->m_data + lVar17 + 0xc);
        auVar20._4_4_ = pVVar11->m_data[0];
        auVar20._0_4_ = *(undefined4 *)((long)pVVar11->m_data + lVar17);
        auVar20._8_8_ = 0;
        auVar5._4_4_ = pVVar11->m_data[3];
        auVar5._0_4_ = fVar19;
        auVar5._8_8_ = 0;
        auVar21 = divps(auVar20,auVar5);
        fVar2 = *(float *)((long)pVVar11[1].m_data + lVar17 + 0xc);
        auVar26._4_4_ = pVVar11->m_data[1];
        auVar26._0_4_ = *(undefined4 *)((long)pVVar11[1].m_data + lVar17 + 4);
        auVar26._8_8_ = 0;
        auVar23._4_4_ = pVVar11->m_data[3];
        auVar23._0_4_ = fVar2;
        auVar23._8_8_ = 0;
        auVar27 = divps(auVar26,auVar23);
        if (bVar7 != (auVar27._0_4_ - auVar27._4_4_) * (auVar21._0_4_ - auVar21._4_4_) -
                     (*(float *)((long)pVVar11->m_data + lVar17 + 4) / fVar19 - auVar27._4_4_) *
                     (*(float *)((long)pVVar11[1].m_data + lVar17) / fVar2 - auVar21._4_4_) < 0.0) {
          pfVar15 = (float *)((long)pVVar11->m_data + lVar17);
          local_198[8] = 0.0;
          local_198[9] = 0.0;
          local_198[10] = 0.0;
          local_198[0xb] = 0.0;
          local_198[4] = 0.0;
          local_198[5] = 0.0;
          local_198[6] = 0.0;
          local_198[7] = 0.0;
          local_198[0] = 0.0;
          local_198[1] = 0.0;
          local_198[2] = 0.0;
          local_198[3] = 0.0;
          local_1c8 = *(undefined1 (*) [8])pVVar11->m_data;
          pSStack_1c0 = *(pointer *)(pVVar11->m_data + 2);
          local_168 = false;
          local_1b8 = *(pointer *)pfVar15;
          afStack_1b0 = *(float (*) [2])(pfVar15 + 2);
          local_167 = false;
          local_1a8 = *(float (*) [2])((long)pVVar11[1].m_data + lVar17);
          afStack_1a0 = *(float (*) [2])((long)pVVar11[1].m_data + lVar17 + 8);
          local_166 = false;
          std::
          vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
          ::push_back(&local_208,(value_type *)local_1c8);
          pVVar11 = local_228.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pVVar12 = local_228.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        lVar16 = lVar16 + 1;
        lVar17 = lVar17 + 0x10;
      } while (lVar16 < ((long)pVVar12 - (long)pVVar11) * 0x10000000 + -0x100000000 >> 0x20);
    }
  }
  iVar8 = (*((this->super_BaseRenderingCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar16 = CONCAT44(extraout_var,iVar8);
  (**(code **)(lVar16 + 0x5e0))(0xb44);
  (**(code **)(lVar16 + 0x418))(*(undefined4 *)&(this->super_BaseRenderingCase).field_0xc4);
  (**(code **)(lVar16 + 0x6c0))(this->m_faceOrder);
  local_1c8 = (undefined1  [8])
              ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_1c0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pSStack_1c0,"Setting front face to ",0x16);
  pcVar9 = glu::getWindingName(this->m_faceOrder);
  iVar8 = (int)(ostringstream *)&pSStack_1c0;
  if (pcVar9 == (char *)0x0) {
    std::ios::clear(iVar8 + (int)*(undefined8 *)(pSStack_1c0[-1].colors[1].m_data + 3));
  }
  else {
    sVar10 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_1c0,pcVar9,sVar10);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_1c0);
  std::ios_base::~ios_base(local_150);
  local_1c8 = (undefined1  [8])
              ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_1c0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pSStack_1c0,"Setting cull face to ",0x15);
  pcVar9 = glu::getFaceName(*(int *)&(this->super_BaseRenderingCase).field_0xc4);
  if (pcVar9 == (char *)0x0) {
    std::ios::clear(iVar8 + (int)*(undefined8 *)(pSStack_1c0[-1].colors[1].m_data + 3));
  }
  else {
    sVar10 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_1c0,pcVar9,sVar10);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_1c0);
  std::ios_base::~ios_base(local_150);
  local_1c8 = (undefined1  [8])
              ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_1c0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pSStack_1c0,"Drawing test pattern (",0x16);
  pcVar9 = glu::getPrimitiveTypeName(this->m_primitive);
  if (pcVar9 == (char *)0x0) {
    std::ios::clear(iVar8 + (int)*(undefined8 *)(pSStack_1c0[-1].colors[1].m_data + 3));
  }
  else {
    sVar10 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_1c0,pcVar9,sVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_1c0,")",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_1c0);
  std::ios_base::~ios_base(local_150);
  BaseRenderingCase::drawPrimitives
            (&this->super_BaseRenderingCase,&local_1e0,&local_228,this->m_primitive);
  local_48.numSamples = (this->super_BaseRenderingCase).m_numSamples;
  local_48.subpixelBits = (this->super_BaseRenderingCase).m_subpixelBits;
  local_48.redBits = (this->super_BaseRenderingCase).m_pixelFormat.redBits;
  local_48.greenBits = (this->super_BaseRenderingCase).m_pixelFormat.greenBits;
  local_48.blueBits = (this->super_BaseRenderingCase).m_pixelFormat.blueBits;
  local_1c8 = (undefined1  [8])
              local_208.
              super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pSStack_1c0 = local_208.
                super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_1b8 = local_208.
              super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_208.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar7 = tcu::verifyTriangleGroupRasterization
                    (&local_1e0,(TriangleSceneSpec *)local_1c8,&local_48,
                     ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx)->m_log,VERIFICATIONMODE_WEAK);
  pcVar9 = "Incorrect rendering";
  if (bVar7) {
    pcVar9 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             (uint)!bVar7,pcVar9);
  if (local_1c8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1c8,(long)local_1b8 - (long)local_1c8);
  }
  if (local_208.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.
                    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.
                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.
                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_228.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_228.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&local_1e0);
  return STOP;
}

Assistant:

CullingTest::IterateResult CullingTest::iterate (void)
{
	tcu::Surface									resultImage(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>							drawBuffer;
	std::vector<TriangleSceneSpec::SceneTriangle>	triangles;

	// generate scene
	generateVertices(drawBuffer);
	extractTriangles(triangles, drawBuffer);

	// draw image
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		gl.enable(GL_CULL_FACE);
		gl.cullFace(m_cullMode);
		gl.frontFace(m_faceOrder);

		m_testCtx.getLog() << tcu::TestLog::Message << "Setting front face to " << glu::getWindingName(m_faceOrder) << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Setting cull face to " << glu::getFaceName(m_cullMode) << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Drawing test pattern (" << glu::getPrimitiveTypeName(m_primitive) << ")" << tcu::TestLog::EndMessage;

		drawPrimitives(resultImage, drawBuffer, m_primitive);
	}

	// compare
	{
		RasterizationArguments	args;
		TriangleSceneSpec		scene;

		args.numSamples		= m_numSamples;
		args.subpixelBits	= m_subpixelBits;
		args.redBits		= getPixelFormat().redBits;
		args.greenBits		= getPixelFormat().greenBits;
		args.blueBits		= getPixelFormat().blueBits;

		scene.triangles.swap(triangles);

		if (verifyTriangleGroupRasterization(resultImage, scene, args, m_testCtx.getLog(), tcu::VERIFICATIONMODE_WEAK))
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Incorrect rendering");
	}

	return STOP;
}